

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes
          (JsBuiltInEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  PropertyId propertyId;
  JavascriptLibrary *this_00;
  JavascriptString *propertyName;
  DynamicObject *pDVar1;
  Var pvVar2;
  DynamicObject **ppDVar3;
  JavascriptFunction *ptr;
  Var arrayIterator;
  JavascriptString *methodName;
  JavascriptLibrary *library;
  ScriptContext *scriptContext_local;
  JsBuiltInEngineInterfaceExtensionObject *this_local;
  
  this_00 = ScriptContext::GetLibrary(scriptContext);
  propertyName = JavascriptString::NewWithSz(L"ArrayIterator",scriptContext);
  pDVar1 = JavascriptLibrary::GetChakraLib(this_00);
  propertyId = Js::JavascriptOperators::GetPropertyId(propertyName,scriptContext);
  pvVar2 = Js::JavascriptOperators::GetProperty
                     (&pDVar1->super_RecyclableObject,propertyId,scriptContext,
                      (PropertyValueInfo *)0x0);
  pDVar1 = VarTo<Js::DynamicObject>(pvVar2);
  pvVar2 = Js::JavascriptOperators::GetProperty
                     (&pDVar1->super_RecyclableObject,0x124,scriptContext,(PropertyValueInfo *)0x0);
  pDVar1 = VarTo<Js::DynamicObject>(pvVar2);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this_00->super_JavascriptLibraryBase).arrayIteratorPrototype,pDVar1);
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).arrayIteratorPrototype);
  pvVar2 = Js::JavascriptOperators::GetProperty
                     (&(*ppDVar3)->super_RecyclableObject,0x107,scriptContext,
                      (PropertyValueInfo *)0x0);
  ptr = VarTo<Js::JavascriptFunction>(pvVar2);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&(this_00->super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction,ptr);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes(ScriptContext * scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptString * methodName = JavascriptString::NewWithSz(_u("ArrayIterator"), scriptContext);
        auto arrayIterator = JavascriptOperators::GetProperty(library->GetChakraLib(), JavascriptOperators::GetPropertyId(methodName, scriptContext), scriptContext);
        library->arrayIteratorPrototype = VarTo<DynamicObject>(JavascriptOperators::GetProperty(VarTo<DynamicObject>(arrayIterator), PropertyIds::prototype, scriptContext));
        library->arrayIteratorPrototypeBuiltinNextFunction = VarTo<JavascriptFunction>(JavascriptOperators::GetProperty(library->arrayIteratorPrototype, PropertyIds::next, scriptContext));
    }